

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void do_proficiencies(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  long lVar3;
  CProficiencies *pCVar4;
  CHAR_DATA *trainer;
  
  if ((ch->act[0] & 1) == 0) {
    pCVar2 = ch->in_room->people;
    if (pCVar2 == (CHAR_DATA *)0x0) {
      trainer = (char_data *)0x0;
    }
    else {
      bVar1 = false;
      trainer = (CHAR_DATA *)0x0;
      do {
        if ((pCVar2->act[0] & 1) != 0) {
          lVar3 = 0;
          do {
            if (-1 < pCVar2->pIndexData->profs_taught[lVar3]) {
              bVar1 = true;
              trainer = pCVar2;
              break;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
        }
        pCVar2 = pCVar2->next_in_room;
      } while ((pCVar2 != (CHAR_DATA *)0x0) && (!bVar1));
    }
    if ((trainer == (char_data *)0x0) && (bVar1 = str_cmp(argument,"basic"), bVar1)) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar4 = &prof_none;
      }
      else {
        pCVar4 = &ch->pcdata->profs;
      }
      CProficiencies::ListKnownProficiencies(pCVar4,ch);
      return;
    }
    pCVar4 = (CProficiencies *)argument;
    bVar1 = str_cmp(argument,"basic");
    if (!bVar1) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar4 = &prof_none;
      }
      else {
        pCVar4 = &ch->pcdata->profs;
      }
      CProficiencies::ListBasicProficiencies(pCVar4,ch);
      return;
    }
    if (trainer != (char_data *)0x0) {
      if (*argument == '\0') {
        CProficiencies::GetProfsTaughtByTrainer(pCVar4,ch,trainer);
        return;
      }
      CProficiencies::TrainProficiency(pCVar4,ch,trainer,argument);
      return;
    }
  }
  return;
}

Assistant:

void do_proficiencies(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *trainer = nullptr;
	bool bBreak= false;

	if (IS_NPC(ch))
		return;

	for (auto iterator = ch->in_room->people; iterator && !bBreak; iterator = iterator->next_in_room)
	{
		if (!IS_NPC(iterator))
			continue;

		for (int i = 0; i < MAX_PROFS_TAUGHT_BY_MOB && !bBreak; i++)
		{
			if (iterator->pIndexData->profs_taught[i] > -1)
			{
				bBreak = true;
				trainer = iterator;
				break;
			}
		}
	}

	if (!trainer && str_cmp(argument, "basic"))
	{
		ch->Profs()->ListKnownProficiencies(ch);
		return;
	}
	else if (!str_cmp(argument, "basic"))
	{
		ch->Profs()->ListBasicProficiencies(ch);
		return;
	}

	if (!trainer)
		return;

	if (argument[0] != '\0')
	{
		ch->Profs()->TrainProficiency(ch, trainer, argument);
		return;
	}

	ch->Profs()->GetProfsTaughtByTrainer(ch, trainer);
}